

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

Duration absl::lts_20250127::Ceil(Duration d,Duration unit)

{
  uint32_t uVar1;
  uint32_t uVar2;
  HiRep HVar3;
  HiRep HVar4;
  bool bVar5;
  Duration rhs;
  Duration local_30;
  
  uVar1 = unit.rep_lo_;
  HVar3 = unit.rep_hi_;
  local_30 = Trunc(d,unit);
  if (local_30.rep_hi_ == d.rep_hi_) {
    bVar5 = local_30.rep_lo_ < d.rep_lo_;
  }
  else {
    bVar5 = (long)local_30.rep_hi_ < (long)d.rep_hi_;
  }
  if (bVar5) {
    HVar4 = HVar3;
    uVar2 = uVar1;
    if ((long)HVar3 < 0) {
      uVar2 = 0xffffffff;
      HVar4.lo_ = 0xffffffff;
      HVar4.hi_ = 0x7fffffff;
      if (uVar1 != 0xffffffff) {
        if (uVar1 == 0) {
          HVar4 = (HiRep)-(long)HVar3;
          uVar2 = 0;
        }
        else {
          HVar4 = (HiRep)~(ulong)HVar3;
          uVar2 = 4000000000 - uVar1;
        }
      }
    }
    rhs.rep_lo_ = uVar2;
    rhs.rep_hi_ = HVar4;
    Duration::operator+=(&local_30,rhs);
  }
  return local_30;
}

Assistant:

Duration Ceil(const Duration d, const Duration unit) {
  const absl::Duration td = Trunc(d, unit);
  return td >= d ? td : td + AbsDuration(unit);
}